

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_create(secp256k1_context *ctx,secp256k1_keypair *keypair,uchar *seckey32)

{
  int iVar1;
  undefined1 local_a0 [4];
  int ret;
  secp256k1_ge pk;
  secp256k1_scalar sk;
  uchar *seckey32_local;
  secp256k1_keypair *keypair_local;
  secp256k1_context *ctx_local;
  
  if (keypair == (secp256k1_keypair *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"keypair != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(keypair,0,0x60);
    iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
    if (iVar1 == 0) {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)");
      ctx_local._4_4_ = 0;
    }
    else if (seckey32 == (uchar *)0x0) {
      secp256k1_callback_call(&ctx->illegal_callback,"seckey32 != NULL");
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ =
           secp256k1_ec_pubkey_create_helper
                     (&ctx->ecmult_gen_ctx,(secp256k1_scalar *)&pk.infinity,(secp256k1_ge *)local_a0
                      ,seckey32);
      secp256k1_keypair_save(keypair,(secp256k1_scalar *)&pk.infinity,(secp256k1_ge *)local_a0);
      secp256k1_memczero(keypair,0x60,(uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
      secp256k1_scalar_clear((secp256k1_scalar *)&pk.infinity);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_keypair_create(const secp256k1_context* ctx, secp256k1_keypair *keypair, const unsigned char *seckey32) {
    secp256k1_scalar sk;
    secp256k1_ge pk;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(keypair != NULL);
    memset(keypair, 0, sizeof(*keypair));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey32 != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &sk, &pk, seckey32);
    secp256k1_keypair_save(keypair, &sk, &pk);
    secp256k1_memczero(keypair, sizeof(*keypair), !ret);

    secp256k1_scalar_clear(&sk);
    return ret;
}